

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void __thiscall
dxil_spv::CFGStructurizer::hoist_switch_branches_to_frontier
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge,CFGNode *dominance_frontier_candidate)

{
  SPIRVModule *this_00;
  pointer pPVar1;
  pointer pIVar2;
  pointer ppCVar3;
  bool bVar4;
  uint32_t id;
  Id type_id;
  PHI *phi;
  CFGNode *this_01;
  Operation *pOVar5;
  Builder *this_02;
  pointer pPVar6;
  pointer ppCVar7;
  pointer pCVar8;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __position;
  CFGNode *pCVar9;
  pointer pCVar10;
  pointer pIVar11;
  Case *c;
  uint32_t uVar12;
  Operation *bor;
  Vector<CFGNode_*> succs;
  CFGNode *local_90;
  Operation *local_88;
  uint32_t local_7c;
  pointer local_78;
  Vector<CFGNode_*> *local_70;
  CFGNode *local_68;
  CFGNode *local_60;
  Vector<Operation_*> *local_58;
  Operation *local_50;
  _Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_48;
  
  local_68 = merge;
  this_01 = create_helper_pred_block(this,node);
  local_58 = &(this_01->ir).operations;
  std::_Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
  _Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)local_58,(_Vector_impl_data *)&(node->ir).operations);
  local_70 = &node->succ;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::vector
            ((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
             &local_48,local_70);
  while( true ) {
    if (local_48._M_impl.super__Vector_impl_data._M_start ==
        local_48._M_impl.super__Vector_impl_data._M_finish) goto LAB_00133545;
    local_90 = *local_48._M_impl.super__Vector_impl_data._M_start;
    bVar4 = query_reachability(this,local_90,dominance_frontier_candidate);
    if (bVar4) break;
    local_48._M_impl.super__Vector_impl_data._M_start =
         local_48._M_impl.super__Vector_impl_data._M_start + 1;
  }
  pCVar10 = (node->ir).terminator.cases.
            super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = 0;
  local_78 = pCVar10;
  local_60 = dominance_frontier_candidate;
  for (pCVar8 = (node->ir).terminator.cases.
                super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar9 = local_68, pCVar8 != pCVar10;
      pCVar8 = pCVar8 + 1) {
    if (pCVar8->node == local_90) {
      pOVar5 = build_switch_case_equal_check(this,node,this_01,pCVar8);
      if (uVar12 != 0) {
        this_00 = this->module;
        local_50 = pOVar5;
        id = SPIRVModule::allocate_id(this_00);
        local_7c = uVar12;
        this_02 = SPIRVModule::get_builder(this->module);
        type_id = spv::Builder::makeBoolType(this_02);
        dominance_frontier_candidate = local_60;
        local_88 = SPIRVModule::allocate_op(this_00,OpLogicalOr,id,type_id);
        Operation::add_id(local_88,local_7c);
        Operation::add_id(local_88,local_50->id);
        std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::
        push_back(local_58,&local_88);
        pOVar5 = local_88;
      }
      uVar12 = pOVar5->id;
      pCVar10 = local_78;
    }
  }
  if (local_90 == dominance_frontier_candidate) {
    pPVar1 = (dominance_frontier_candidate->ir).phi.
             super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar6 = (dominance_frontier_candidate->ir).phi.
                  super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
                  _M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar1; pPVar6 = pPVar6 + 1) {
      pIVar2 = (pPVar6->incoming).
               super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar11 = (pPVar6->incoming).
                     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar11 != pIVar2;
          pIVar11 = pIVar11 + 1) {
        if (pIVar11->block == node) {
          pIVar11->block = this_01;
        }
      }
    }
  }
  ppCVar3 = (local_90->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar7 = (local_90->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar3;
      ppCVar7 = ppCVar7 + 1) {
    if (*ppCVar7 == node) {
      *ppCVar7 = this_01;
    }
  }
  pCVar10 = (node->ir).terminator.cases.
            super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar8 = (node->ir).terminator.cases.
                super__Vector_base<dxil_spv::Terminator::Case,_dxil_spv::ThreadLocalAllocator<dxil_spv::Terminator::Case>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar8 != pCVar10; pCVar8 = pCVar8 + 1) {
    if (pCVar8->node == local_90) {
      pCVar8->node = local_68;
    }
  }
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                         ((node->succ).
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (node->succ).
                          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&local_90);
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::erase
            (local_70,(const_iterator)__position._M_current);
  CFGNode::add_branch(node,pCVar9);
  CFGNode::add_branch(this_01,local_90);
  pCVar9 = local_90;
  if (local_90 == dominance_frontier_candidate) {
    pCVar9 = CFGNode::rewrite_branch_through_intermediate_node
                       (this_01,dominance_frontier_candidate,dominance_frontier_candidate);
  }
  (this_01->ir).terminator.type = Condition;
  (this_01->ir).terminator.conditional_id = uVar12;
  (this_01->ir).terminator.true_block = pCVar9;
  (this_01->ir).terminator.false_block = node;
  (this_01->ir).terminator.direct_block = (CFGNode *)0x0;
LAB_00133545:
  std::_Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
  ~_Vector_base(&local_48);
  return;
}

Assistant:

void CFGStructurizer::hoist_switch_branches_to_frontier(CFGNode *node, CFGNode *merge,
                                                        CFGNode *dominance_frontier_candidate)
{
	// Dispatch to the dominance frontier before we enter switch scope.
	auto *pred = create_helper_pred_block(node);
	std::swap(pred->ir.operations, node->ir.operations);

	auto succs = node->succ;
	for (auto *succ : succs)
	{
		if (!query_reachability(*succ, *dominance_frontier_candidate))
			continue;

		// Rewrite the case label to reach merge block in a unique path.
		// That way we can PHI select whether to branch to dominance frontier or not
		// in the switch merge block.

		spv::Id cond_id = 0;
		for (auto &c : node->ir.terminator.cases)
		{
			if (c.node == succ)
			{
				auto *ieq = build_switch_case_equal_check(node, pred, c);

				if (cond_id)
				{
					auto *bor = module.allocate_op(spv::OpLogicalOr, module.allocate_id(),
					                               module.get_builder().makeBoolType());
					bor->add_id(cond_id);
					bor->add_id(ieq->id);
					pred->ir.operations.push_back(bor);
					cond_id = bor->id;
				}
				else
				{
					cond_id = ieq->id;
				}
			}
		}

		if (succ == dominance_frontier_candidate)
		{
			// We're directly branching to target, so might have to rewrite PHI incoming
			// block to pred helper block instead.
			for (auto &phi : dominance_frontier_candidate->ir.phi)
				for (auto &incoming : phi.incoming)
					if (incoming.block == node)
						incoming.block = pred;
		}

		for (auto *&p : succ->pred)
			if (p == node)
				p = pred;

		for (auto &c : node->ir.terminator.cases)
			if (c.node == succ)
				c.node = merge;

		node->succ.erase(std::find(node->succ.begin(), node->succ.end(), succ));
		node->add_branch(merge);
		pred->add_branch(succ);

		// Make sure that our selection branch has somewhere to merge if it has to.
		if (succ == dominance_frontier_candidate)
		{
			succ = pred->rewrite_branch_through_intermediate_node(dominance_frontier_candidate,
			                                                      dominance_frontier_candidate);
		}

		pred->ir.terminator.type = Terminator::Type::Condition;
		pred->ir.terminator.conditional_id = cond_id;
		pred->ir.terminator.true_block = succ;
		pred->ir.terminator.false_block = node;
		pred->ir.terminator.direct_block = nullptr;

		// Have to assume that there is only one path to this frontier,
		// otherwise we're in a world of impossible case merges
		// which should have been handled elsewhere ...
		return;
	}
}